

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime.c
# Opt level: O1

void * helper_lookup_tb_ptr_riscv64(CPUArchState_conflict26 *env)

{
  target_ulong tVar1;
  CPURISCVState_conflict1 *env_00;
  ulong pc;
  _Bool _Var2;
  uint flags;
  TranslationBlock *pTVar3;
  uint32_t cf_mask;
  TranslationBlock *pTVar4;
  tb_tc *ptVar5;
  ulong uVar6;
  
  tVar1 = env[-2].gpr[0x1b];
  env_00 = (CPURISCVState_conflict1 *)env[-0x17].gpr[0x1f];
  pc = env_00->pc;
  flags = riscv_cpu_mmu_index_riscv64(env_00,false);
  _Var2 = riscv_cpu_fp_enabled_riscv64(env_00);
  if (_Var2) {
    flags = flags | (uint)env_00->mstatus & 0x6000;
  }
  uVar6 = pc >> 6 ^ pc;
  uVar6 = (ulong)((uint)uVar6 & 0x3f | (uint)(uVar6 >> 6) & 0xfc0);
  pTVar4 = *(TranslationBlock **)((long)env + uVar6 * 8 + -0x8bd8);
  cf_mask = *(int *)((long)env[-2].gpr + 0xc4) << 0x18;
  if ((((pTVar4 == (TranslationBlock *)0x0) || (pTVar4->pc != pc)) || (pTVar4->cs_base != 0)) ||
     (((pTVar4->flags != flags || (env[-2].gpr[0x17] != (ulong)pTVar4->trace_vcpu_dstate)) ||
      ((pTVar4->cflags & 0xff0effff) != cf_mask)))) {
    pTVar3 = tb_htable_lookup_riscv64
                       ((CPUState *)&env[-0x18].pmp_state.num_rules,pc,0,flags,cf_mask);
    pTVar4 = (TranslationBlock *)0x0;
    if (pTVar3 != (TranslationBlock *)0x0) {
      *(TranslationBlock **)((long)env + uVar6 * 8 + -0x8bd8) = pTVar3;
      pTVar4 = pTVar3;
    }
  }
  if (pTVar4 == (TranslationBlock *)0x0) {
    ptVar5 = (tb_tc *)(*(long *)(tVar1 + 0x2e8) + 0x98);
  }
  else {
    ptVar5 = &pTVar4->tc;
  }
  return ptVar5->ptr;
}

Assistant:

void *HELPER(lookup_tb_ptr)(CPUArchState *env)
{
    CPUState *cpu = env_cpu(env);
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, curr_cflags());
    if (tb == NULL) {
        return uc->tcg_ctx->code_gen_epilogue;
    }
    return tb->tc.ptr;
}